

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Fts5TokenizerModule * fts5LocateTokenizer(Fts5Global *pGlobal,char *zName)

{
  byte bVar1;
  byte bVar2;
  Fts5TokenizerModule *pFVar3;
  long lVar4;
  
  if (zName == (char *)0x0) {
    return pGlobal->pDfltTok;
  }
  pFVar3 = pGlobal->pTok;
  while( true ) {
    if (pFVar3 == (Fts5TokenizerModule *)0x0) {
      return (Fts5TokenizerModule *)0x0;
    }
    if (pFVar3->zName != (char *)0x0) break;
LAB_001c7472:
    pFVar3 = pFVar3->pNext;
  }
  lVar4 = 0;
  do {
    bVar1 = zName[lVar4];
    bVar2 = pFVar3->zName[lVar4];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) {
        return pFVar3;
      }
    }
    else if (""[bVar1] != ""[bVar2]) goto LAB_001c7472;
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

static Fts5TokenizerModule *fts5LocateTokenizer(
  Fts5Global *pGlobal, 
  const char *zName
){
  Fts5TokenizerModule *pMod = 0;

  if( zName==0 ){
    pMod = pGlobal->pDfltTok;
  }else{
    for(pMod=pGlobal->pTok; pMod; pMod=pMod->pNext){
      if( sqlite3_stricmp(zName, pMod->zName)==0 ) break;
    }
  }

  return pMod;
}